

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

void __thiscall CTransaction::CTransaction(CTransaction *this,CMutableTransaction *tx)

{
  long lVar1;
  uint32_t uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&this->vin,&tx->vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&this->vout,&tx->vout);
  uVar2 = tx->nLockTime;
  this->version = tx->version;
  this->nLockTime = uVar2;
  bVar3 = ComputeHasWitness(this);
  this->m_has_witness = bVar3;
  ComputeHash(&this->hash,this);
  ComputeWitnessHash(&this->m_witness_hash,this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTransaction::CTransaction(const CMutableTransaction& tx) : vin(tx.vin), vout(tx.vout), version{tx.version}, nLockTime{tx.nLockTime}, m_has_witness{ComputeHasWitness()}, hash{ComputeHash()}, m_witness_hash{ComputeWitnessHash()} {}